

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

Pattern * slang::ast::StructurePattern::fromSyntax
                    (StructurePatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *pSVar1;
  int iVar2;
  size_t sVar3;
  sockaddr *__addr;
  Type *pTVar4;
  Scope *this;
  SyntaxNode *pSVar5;
  StructurePatternMemberSyntax *pSVar6;
  undefined4 extraout_var;
  Symbol *pSVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructurePattern *child;
  StructurePattern *pSVar8;
  Symbol *extraout_RDX;
  specific_symbol_iterator<slang::ast::FieldSymbol> extraout_RDX_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar9;
  Symbol *extraout_RDX_01;
  bool bVar10;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3;
  StructurePattern *ctx;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar11;
  string_view name;
  const_iterator __begin3;
  specific_symbol_iterator<slang::ast::FieldSymbol> it;
  SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL> patterns;
  StructurePattern local_c8;
  StructurePatternSyntax *local_98;
  SyntaxNode *local_90;
  SmallVectorBase<slang::ast::StructurePattern::FieldPattern> local_88 [2];
  
  ctx = &local_c8;
  local_c8.super_Pattern.sourceRange.startLoc = (SourceLocation)((context->scope).ptr)->compilation;
  pTVar4 = Type::getCanonicalType(targetType);
  this = Symbol::scopeOrNull(&pTVar4->super_Symbol);
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 4;
  pSVar5 = slang::syntax::TokenOrSyntax::node((syntax->members).elements._M_ptr);
  pSVar1 = &syntax->members;
  local_c8.super_Pattern._0_8_ = pSVar1;
  local_98 = syntax;
  if (pSVar5->kind == OrderedStructurePatternMember) {
    sVar11 = Scope::membersOfType<slang::ast::FieldSymbol>(this);
    local_c8.super_Pattern.syntax = (SyntaxNode *)0x0;
    sVar3 = (syntax->members).elements._M_extent._M_extent_value;
    bVar10 = false;
    for (; (local_c8.super_Pattern.sourceRange.endLoc = (SourceLocation)sVar11._M_begin.current,
           (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
           local_c8.super_Pattern._0_8_ != pSVar1 ||
           (local_c8.super_Pattern.syntax != (SyntaxNode *)(sVar3 + 1 >> 1)));
        local_c8.super_Pattern.syntax =
             (SyntaxNode *)((long)&(local_c8.super_Pattern.syntax)->kind + 1)) {
      pSVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
               iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>::dereference
                         ((iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> *)
                          &local_c8);
      __addr = *(sockaddr **)&pSVar6[1].super_SyntaxNode;
      pTVar4 = DeclaredType::getType
                         ((DeclaredType *)((long)local_c8.super_Pattern.sourceRange.endLoc + 0x40));
      local_c8.patterns._M_extent._M_extent_value._0_4_ =
           Pattern::bind((int)context,__addr,(socklen_t)pTVar4);
      local_c8.patterns._M_extent._M_extent_value._4_4_ = extraout_var;
      iVar2 = *(int *)local_c8.patterns._M_extent._M_extent_value;
      local_c8.patterns._M_ptr = (pointer)local_c8.super_Pattern.sourceRange.endLoc;
      SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::
      emplace_back<slang::ast::StructurePattern::FieldPattern>
                (local_88,(FieldPattern *)&local_c8.patterns);
      Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment
                ((specific_symbol_iterator<slang::ast::FieldSymbol> *)
                 &local_c8.super_Pattern.sourceRange.endLoc);
      sVar11._M_end.current = extraout_RDX_00.current;
      sVar11._M_begin.current = (Symbol *)local_c8.super_Pattern.sourceRange.endLoc;
      bVar10 = (bool)(bVar10 | iVar2 == 0);
    }
  }
  else {
    local_c8.super_Pattern.syntax = (SyntaxNode *)0x0;
    local_90 = (SyntaxNode *)((syntax->members).elements._M_extent._M_extent_value + 1 >> 1);
    bVar10 = false;
    sVar9.current = extraout_RDX;
    for (; (sVar11._M_end.current = sVar9.current,
           sVar11._M_begin.current = (Symbol *)local_c8.super_Pattern.sourceRange.endLoc,
           (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
           local_c8.super_Pattern._0_8_ != pSVar1 || (local_c8.super_Pattern.syntax != local_90));
        local_c8.super_Pattern.syntax =
             (SyntaxNode *)((long)&(local_c8.super_Pattern.syntax)->kind + 1)) {
      pSVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
               iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>::dereference
                         ((iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> *)
                          &local_c8);
      name = parsing::Token::valueText((Token *)(pSVar6 + 1));
      pSVar7 = Scope::find(this,name);
      pSVar5 = pSVar6[2].super_SyntaxNode.parent;
      pTVar4 = DeclaredType::getType((DeclaredType *)(pSVar7 + 1));
      local_c8.patterns._M_extent._M_extent_value._0_4_ =
           Pattern::bind((int)context,(sockaddr *)pSVar5,(socklen_t)pTVar4);
      local_c8.patterns._M_extent._M_extent_value._4_4_ = extraout_var_00;
      iVar2 = *(int *)local_c8.patterns._M_extent._M_extent_value;
      local_c8.patterns._M_ptr = (pointer)pSVar7;
      SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::
      emplace_back<slang::ast::StructurePattern::FieldPattern>
                (local_88,(FieldPattern *)&local_c8.patterns);
      bVar10 = (bool)(bVar10 | iVar2 == 0);
      sVar9.current = extraout_RDX_01;
    }
  }
  local_c8.super_Pattern.sourceRange.endLoc = (SourceLocation)sVar11._M_begin.current;
  local_c8.super_Pattern.kind =
       SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::copy
                 (local_88,(EVP_PKEY_CTX *)local_c8.super_Pattern.sourceRange.startLoc,
                  (EVP_PKEY_CTX *)sVar11._M_end.current.current);
  local_c8.super_Pattern._4_4_ = extraout_var_01;
  local_c8.patterns =
       (span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>)
       slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_98);
  child = BumpAllocator::
          emplace<slang::ast::StructurePattern,std::span<slang::ast::StructurePattern::FieldPattern,18446744073709551615ul>,slang::SourceRange>
                    ((BumpAllocator *)local_c8.super_Pattern.sourceRange.startLoc,
                     (span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *)
                     &local_c8,(SourceRange *)&local_c8.patterns);
  pSVar8 = child;
  if (bVar10) {
    pSVar8 = (StructurePattern *)
             Pattern::badPattern((Compilation *)local_c8.super_Pattern.sourceRange.startLoc,
                                 &child->super_Pattern);
    ctx = child;
  }
  SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::cleanup(local_88,(EVP_PKEY_CTX *)ctx)
  ;
  return &pSVar8->super_Pattern;
}

Assistant:

Pattern& StructurePattern::fromSyntax(const StructurePatternSyntax& syntax, const Type& targetType,
                                      const ASTContext& context) {
    auto& comp = context.getCompilation();
    SLANG_ASSERT(targetType.isStruct() && !syntax.members.empty());

    bool bad = false;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    SmallVector<FieldPattern, 4> patterns;
    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            SLANG_ASSERT(it != fields.end());

            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            auto& pattern = bind(context, patternSyntax, it->getType());
            bad |= pattern.bad();

            patterns.push_back({&(*it), &pattern});
            it++;
        }

        SLANG_ASSERT(it == fields.end());
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            SLANG_ASSERT(member);

            auto& field = member->as<FieldSymbol>();
            auto& pattern = bind(context, *nspms.pattern, field.getType());
            bad |= pattern.bad();

            patterns.push_back({&field, &pattern});
        }
    }

    auto result = comp.emplace<StructurePattern>(patterns.copy(comp), syntax.sourceRange());
    if (bad)
        return badPattern(comp, result);

    return *result;
}